

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O2

bool tinyusdz::usda::IsUSDA(string *filename,size_t max_filesize)

{
  bool bVar1;
  bool bVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string err;
  StreamReader sr;
  AsciiParser parser;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_538;
  string local_518;
  StreamReader local_4f8;
  AsciiParser local_4d8;
  
  local_538._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_538._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_538._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  local_518._M_string_length = 0;
  local_518.field_2._M_local_buf[0] = '\0';
  bVar2 = false;
  bVar1 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_538,
                            &local_518,filename,max_filesize,(void *)0x0);
  if (bVar1) {
    local_4f8.length_ =
         (long)local_538._M_impl.super__Vector_impl_data._M_finish -
         (long)local_538._M_impl.super__Vector_impl_data._M_start;
    local_4f8.binary_ = local_538._M_impl.super__Vector_impl_data._M_start;
    local_4f8.swap_endian_ = false;
    local_4f8.idx_ = 0;
    ascii::AsciiParser::AsciiParser(&local_4d8,&local_4f8);
    bVar2 = ascii::AsciiParser::CheckHeader(&local_4d8);
    ascii::AsciiParser::~AsciiParser(&local_4d8);
  }
  ::std::__cxx11::string::_M_dispose();
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_538);
  return bVar2;
}

Assistant:

bool IsUSDA(const std::string &filename, size_t max_filesize) {
  // TODO: Read only first N bytes
  std::vector<uint8_t> data;
  std::string err;

  if (!io::ReadWholeFile(&data, &err, filename, max_filesize)) {
    return false;
  }

  tinyusdz::StreamReader sr(data.data(), data.size(), /* swap endian */ false);
  tinyusdz::ascii::AsciiParser parser(&sr);

  return parser.CheckHeader();
}